

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::iterate(InvalidShaderCompilerCase *this)

{
  long lVar1;
  TestContext *this_00;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  deUint64 dVar10;
  undefined4 extraout_var_06;
  deUint64 dVar11;
  undefined4 extraout_var_07;
  deUint64 dVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar13;
  Performance *pPVar14;
  size_type *psVar15;
  int precision;
  Performance *pPVar16;
  char *pcVar17;
  ShaderValidity validity;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Alloc_hider _Var24;
  long lVar25;
  Logs *__return_storage_ptr__;
  float fVar26;
  undefined4 extraout_XMM0_Db;
  Shaders shaders_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_11;
  char *vertShaderSourceCStr_1;
  vector<long,_std::allocator<long>_> rangeTimes;
  ProgramContext progCtx;
  BuildInfo buildInfo;
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  measurements;
  vector<long,_std::allocator<long>_> totalTimes;
  BuildInfo latestBuildInfo;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  ProgramContext latestProgramContext;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  TestLog *local_3f0;
  undefined1 local_3e8 [32];
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  qpKeyValueTag local_320;
  float local_31c;
  undefined8 local_318;
  string local_308;
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  undefined1 local_2d8 [24];
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  qpKeyValueTag local_288;
  float local_284;
  ios_base local_278 [8];
  ios_base local_270 [264];
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  local_168;
  vector<long,_std::allocator<long>_> local_150;
  vector<long,_std::allocator<long>_> local_138;
  undefined1 local_120 [8];
  Shaders local_118;
  undefined1 local_110 [16];
  string local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  code *local_d8;
  uint local_cc;
  vector<long,_std::allocator<long>_> local_c8;
  vector<long,_std::allocator<long>_> local_a8;
  vector<long,_std::allocator<long>_> local_88;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  validity = SHADER_VALIDITY_INVALID_CHAR;
  if (this->m_invalidityType != INVALIDITY_INVALID_CHAR) {
    validity = this->m_invalidityType == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  }
  uVar18 = this->m_startHash ^ 0xc0a9496a;
  local_380._0_8_ = &local_370;
  local_380._8_8_ = 0;
  local_370._M_local_buf[0] = '\0';
  local_360._M_p = (pointer)&local_350;
  local_358 = 0;
  local_350._M_local_buf[0] = '\0';
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_120 + 0x10);
  local_70._0_4_ = 0x122;
  local_70._4_4_ = 0;
  local_388._M_p = (pointer)this;
  local_120 = (undefined1  [8])paVar23;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_120,(ulong)local_70);
  uVar3 = local_70._0_8_;
  local_110._0_8_ = local_70._0_8_;
  local_120 = (undefined1  [8])paVar9;
  memcpy(paVar9,
         "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec4 a_value${NAME_SPEC};\nvarying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x122);
  uVar4 = local_70._0_8_;
  local_70._0_4_ = (undefined4)uVar3;
  local_70._4_4_ = SUB84(uVar3,4);
  local_118.vertShader = local_70._0_4_;
  local_118.fragShader = local_70._4_4_;
  paVar9->_M_local_buf[uVar3] = '\0';
  local_70._0_8_ = uVar4;
  specializeShaderSource((string *)local_2e8,(string *)local_120,uVar18,validity);
  std::__cxx11::string::operator=((string *)local_380,(string *)local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
  }
  if (local_120 != (undefined1  [8])paVar23) {
    operator_delete((void *)local_120,local_110._0_8_ + 1);
  }
  local_70._0_4_ = 0x8d;
  local_70._4_4_ = 0;
  local_120 = (undefined1  [8])paVar23;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_120,(ulong)local_70);
  uVar3 = local_70._0_8_;
  __return_storage_ptr__ = (Logs *)local_120;
  local_110._0_8_ = local_70._0_8_;
  local_120 = (undefined1  [8])paVar9;
  memcpy(paVar9,
         "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x8d);
  uVar4 = local_70._0_8_;
  local_70._0_4_ = (undefined4)uVar3;
  local_70._4_4_ = SUB84(uVar3,4);
  local_118.vertShader = local_70._0_4_;
  local_118.fragShader = local_70._4_4_;
  paVar9->_M_local_buf[uVar3] = '\0';
  local_70._0_8_ = uVar4;
  specializeShaderSource((string *)local_2e8,(string *)__return_storage_ptr__,uVar18,validity);
  std::__cxx11::string::operator=((string *)&local_360,(string *)local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
  }
  if (local_120 != (undefined1  [8])paVar23) {
    operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
  }
  iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
  dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x3f0))(0x8b31);
  dVar8 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x3f0))(0x8b30);
  local_70._4_4_ = dVar8;
  local_70._0_4_ = dVar7;
  iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
  local_2e8 = (undefined1  [8])local_380._0_8_;
  local_120 = (undefined1  [8])local_360._M_p;
  (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x12b8))(dVar7,1,local_2e8,0);
  (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x12b8))(dVar8,1,local_120,0);
  local_2e0._M_p = local_2d8 + 8;
  local_2d8._0_8_ = 0;
  local_2d8[8] = '\0';
  local_2c0._M_p = local_2b8 + 8;
  local_2b8._0_8_ = 0;
  local_2b8[8] = '\0';
  iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x248))(dVar7);
  (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0xa70))(dVar7,0x8b81,local_120);
  local_2e8[0] = (string)(local_120._0_4_ != 0);
  iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x248))(dVar8);
  (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0xa70))(dVar8,0x8b81,local_120);
  local_2e8[1] = local_120._0_4_ != 0;
  if ((local_120._0_4_ != 0) || (local_2e8[0] != (string)0x0)) {
    getLogs((Logs *)local_120,(InvalidShaderCompilerCase *)local_388._M_p,(Shaders *)local_70);
    std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_120);
    std::__cxx11::string::operator=((string *)&local_2c0,local_100);
    if (local_100 != (string  [8])local_f0) {
      operator_delete((void *)local_100,local_f0._0_8_ + 1);
    }
    if (local_120 != (undefined1  [8])paVar23) {
      operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
    }
    logProgramData((InvalidShaderCompilerCase *)local_388._M_p,(BuildInfo *)local_2e8,
                   (ProgramContext *)local_380);
    iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_09,iVar6) + 0x470))(dVar7);
    (**(code **)(CONCAT44(extraout_var_09,iVar6) + 0x470))(dVar8);
    tcu::TestContext::setTestResult
              (*(TestContext **)(local_388._M_p + 8),QP_TEST_RESULT_FAIL,
               "Compilation of a shader erroneously succeeded");
    if (local_2c0._M_p != local_2b8 + 8) {
      operator_delete(local_2c0._M_p,CONCAT71(local_2b8._9_7_,local_2b8[8]) + 1);
    }
    if (local_2e0._M_p != local_2d8 + 8) {
      operator_delete(local_2e0._M_p,CONCAT71(local_2d8._9_7_,local_2d8[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_p != &local_350) {
      operator_delete(local_360._M_p,
                      CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._0_8_ == &local_370) {
      return STOP;
    }
    uVar19 = CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._0_8_;
  }
  else {
    iVar6 = (*(*(Context **)(local_388._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x470))(dVar7);
    (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x470))(dVar8);
    if (local_2c0._M_p != local_2b8 + 8) {
      operator_delete(local_2c0._M_p,CONCAT71(local_2b8._9_7_,local_2b8[8]) + 1);
    }
    _Var24._M_p = local_388._M_p;
    if (local_2e0._M_p != local_2d8 + 8) {
      operator_delete(local_2e0._M_p,CONCAT71(local_2d8._9_7_,local_2d8[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_p != &local_350) {
      operator_delete(local_360._M_p,
                      CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._0_8_ != &local_370) {
      operator_delete((void *)local_380._0_8_,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    local_168.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Measurement *)0x0;
    local_168.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Measurement *)0x0;
    local_70._0_8_ = (long)local_70 + 0x10;
    local_70._8_8_ = 0;
    local_70[0x10] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_118 = (Shaders)((long)local_110 + 8);
    local_110._0_8_ = (undefined1 *)0x0;
    local_110[8] = '\0';
    local_f8._M_p = local_f0 + 8;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    while( true ) {
      bVar5 = goodEnoughMeasurements((InvalidShaderCompilerCase *)_Var24._M_p,&local_168);
      if (bVar5) break;
      (*(((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).super_TestCase.super_TestNode.
        _vptr_TestNode[5])
                (local_380,_Var24._M_p,
                 (ulong)(uint)((int)((ulong)((long)local_168.
                                                                                                      
                                                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_168.
                                                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              -0x55555555));
      iVar6 = (*((((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      uVar18 = (**(code **)(CONCAT44(extraout_var_04,iVar6) + 0x3f0))(0x8b31);
      local_318 = (**(code **)(CONCAT44(extraout_var_04,iVar6) + 0x3f0))(0x8b30);
      local_470._M_dataplus._M_p = (pointer)((ulong)uVar18 | local_318 << 0x20);
      local_2e0._M_p = local_2d8 + 8;
      local_2d8._0_8_ = 0;
      local_2d8[8] = '\0';
      local_2c0._M_p = local_2b8 + 8;
      local_2b8._0_8_ = 0;
      local_2b8[8] = '\0';
      tcu::warmupCPU();
      local_3f0 = (TestLog *)deGetMicroseconds();
      iVar6 = (*((((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      local_3e8._0_8_ = local_380._0_8_;
      local_450._M_dataplus._M_p = local_360._M_p;
      (**(code **)(CONCAT44(extraout_var_05,iVar6) + 0x12b8))(uVar18,1,local_3e8,0);
      (**(code **)(CONCAT44(extraout_var_05,iVar6) + 0x12b8))(local_318,1,&local_450,0);
      dVar10 = deGetMicroseconds();
      iVar6 = (*((((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_06,iVar6) + 0x248))(uVar18);
      (**(code **)(CONCAT44(extraout_var_06,iVar6) + 0xa70))(uVar18,0x8b81,local_3e8);
      local_2e8[0] = (string)(local_3e8._0_4_ != 0);
      dVar11 = deGetMicroseconds();
      iVar6 = (*((((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_07,iVar6) + 0x248))(local_318);
      (**(code **)(CONCAT44(extraout_var_07,iVar6) + 0xa70))(local_318,0x8b81,local_3e8);
      local_2e8[1] = local_3e8._0_4_ != 0;
      dVar12 = deGetMicroseconds();
      _Var24._M_p = local_388._M_p;
      __return_storage_ptr__ = (Logs *)local_3e8;
      getLogs(__return_storage_ptr__,(InvalidShaderCompilerCase *)local_388._M_p,
              (Shaders *)&local_470);
      std::__cxx11::string::operator=((string *)&local_2e0,(string *)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_p != &local_3b8) {
        operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((local_2e8[0] != (string)0x0) || ((bool)local_2e8[1] == true)) {
        logProgramData((InvalidShaderCompilerCase *)_Var24._M_p,(BuildInfo *)local_2e8,
                       (ProgramContext *)local_380);
        iVar6 = (*(*(Context **)(_Var24._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_10,iVar6) + 0x470))(uVar18);
        (**(code **)(CONCAT44(extraout_var_10,iVar6) + 0x470))(local_318);
        tcu::TestContext::setTestResult
                  (*(TestContext **)(_Var24._M_p + 8),QP_TEST_RESULT_FAIL,
                   "Compilation of a shader erroneously succeeded");
        if (local_2c0._M_p != local_2b8 + 8) {
          operator_delete(local_2c0._M_p,CONCAT71(local_2b8._9_7_,local_2b8[8]) + 1);
        }
        if (local_2e0._M_p != local_2d8 + 8) {
          operator_delete(local_2e0._M_p,CONCAT71(local_2d8._9_7_,local_2d8[8]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_p != &local_350) {
          operator_delete(local_360._M_p,
                          CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._0_8_ == &local_370) goto LAB_004450dc;
        uVar19 = CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._0_8_;
        goto LAB_004450d7;
      }
      iVar6 = (*(*(Context **)(_Var24._M_p + 0x70))->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_08,iVar6) + 0x470))(uVar18);
      (**(code **)(CONCAT44(extraout_var_08,iVar6) + 0x470))(local_318);
      local_3e8._16_8_ = dVar12 - dVar11;
      local_3e8._8_8_ = dVar11 - dVar10;
      local_3e8._0_8_ = dVar10 - (long)local_3f0;
      if (local_168.
          super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_168.
          super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
        ::_M_realloc_insert<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>
                  (&local_168,
                   (iterator)
                   local_168.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Measurement *)local_3e8);
      }
      else {
        (local_168.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->fragmentCompileTime = local_3e8._16_8_;
        (local_168.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sourceSetTime = local_3e8._0_8_;
        (local_168.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->vertexCompileTime = local_3e8._8_8_;
        local_168.
        super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_120._0_2_ = local_2e8._0_2_;
      std::__cxx11::string::_M_assign((string *)(local_120 + 8));
      std::__cxx11::string::_M_assign((string *)&local_f8);
      std::__cxx11::string::_M_assign((string *)local_70);
      std::__cxx11::string::_M_assign((string *)&local_50);
      tcu::TestContext::touchWatchdog(*(TestContext **)(local_388._M_p + 8));
      if (local_2c0._M_p != local_2b8 + 8) {
        operator_delete(local_2c0._M_p,CONCAT71(local_2b8._9_7_,local_2b8[8]) + 1);
      }
      _Var24._M_p = local_388._M_p;
      if (local_2e0._M_p != local_2d8 + 8) {
        operator_delete(local_2e0._M_p,CONCAT71(local_2d8._9_7_,local_2d8[8]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_p != &local_350) {
        operator_delete(local_360._M_p,
                        CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ != &local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) +
                        1);
      }
    }
    local_3f0 = ((((InvalidShaderCompilerCase *)_Var24._M_p)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_380._0_8_ = &local_370;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"IterationMeasurements","");
    local_3e8._0_8_ = local_3e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3e8,"Iteration measurements of compilation times","");
    tcu::LogSection::LogSection((LogSection *)local_2e8,(string *)local_380,(string *)local_3e8);
    tcu::TestLog::startSection(local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_);
    if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
      operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._0_8_ != &local_370) {
      operator_delete((void *)local_380._0_8_,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    if (0 < (int)((ulong)((long)local_168.
                                super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_168.
                               super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      __return_storage_ptr__ = (Logs *)0x8;
      lVar25 = 0;
      do {
        plVar13 = (long *)((long)local_168.
                                 super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                 ._M_impl.super__Vector_impl_data._M_start + -8 +
                          (long)__return_storage_ptr__);
        if (local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar13);
        }
        else {
          *local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *plVar13;
          local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (long *)((long)local_168.
                                    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (long)__return_storage_ptr__));
        }
        else {
          *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *(long *)((long)local_168.
                                       super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                (long)__return_storage_ptr__);
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        plVar13 = (long *)((long)&(__return_storage_ptr__->vert)._M_string_length +
                          (long)local_168.
                                super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar13);
        }
        else {
          *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *plVar13;
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        local_2e8 = (undefined1  [8])
                    (*(long *)((long)local_168.
                                     super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              (long)__return_storage_ptr__) +
                     *(long *)((long)local_168.
                                     super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                     ._M_impl.super__Vector_impl_data._M_start + -8 +
                              (long)__return_storage_ptr__) +
                    *(long *)((long)&(__return_storage_ptr__->vert)._M_string_length +
                             (long)local_168.
                                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
        if (local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_138,
                     (iterator)
                     local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)local_2e8);
        }
        else {
          *local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish = (long)local_2e8;
          local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
        std::ostream::operator<<((string *)local_2e8,(int)lVar25);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
        std::ios_base::~ios_base(local_278);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0x65ea4f);
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar23) {
          local_450.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_450.field_2._8_8_ = plVar13[3];
        }
        else {
          local_450.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_450._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_450._M_string_length = plVar13[1];
        *plVar13 = (long)paVar23;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
        local_3e8._0_8_ = local_3e8 + 0x10;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar23) {
          local_3e8._16_8_ = paVar23->_M_allocated_capacity;
          local_3e8._24_8_ = plVar13[3];
        }
        else {
          local_3e8._16_8_ = paVar23->_M_allocated_capacity;
          local_3e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar13;
        }
        local_3e8._8_8_ = plVar13[1];
        *plVar13 = (long)paVar23;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
        std::ostream::operator<<((string *)local_2e8,(int)lVar25);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
        std::ios_base::~ios_base(local_278);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_3a8,0,(char *)0x0,0x65ea6b);
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430.field_2._8_8_ = plVar13[3];
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        }
        else {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_430._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_430);
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_410.field_2._M_allocated_capacity = *psVar15;
          local_410.field_2._8_4_ = (undefined4)plVar13[3];
          local_410.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar15;
          local_410._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_410._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_2e8 = (undefined1  [8])local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"ms","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_380,(string *)local_3e8,&local_410,(string *)local_2e8,
                   QP_KEY_TAG_TIME,
                   (float)(*(long *)((long)local_168.
                                           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    (long)__return_storage_ptr__) +
                           *(long *)((long)local_168.
                                           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                           ._M_impl.super__Vector_impl_data._M_start + -8 +
                                    (long)__return_storage_ptr__) +
                          *(long *)((long)&(__return_storage_ptr__->vert)._M_string_length +
                                   (long)local_168.
                                         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                         ._M_impl.super__Vector_impl_data._M_start)) / 1000.0);
        tcu::TestLog::writeFloat
                  (local_3f0,(char *)local_380._0_8_,local_360._M_p,local_340._M_p,local_320,
                   local_31c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_p != &local_330) {
          operator_delete(local_340._M_p,local_330._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_p != &local_350) {
          operator_delete(local_360._M_p,
                          CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._0_8_ != &local_370) {
          operator_delete((void *)local_380._0_8_,
                          CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0])
                          + 1);
        }
        if (local_2e8 != (undefined1  [8])local_2d8) {
          operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((Performance *)local_3a8._0_8_ != (Performance *)(local_3a8 + 0x10)) {
          operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_3e8 + 0x10)) {
          operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        lVar25 = lVar25 + 1;
        __return_storage_ptr__ = (Logs *)((__return_storage_ptr__->vert).field_2._M_local_buf + 8);
      } while (lVar25 < (int)((ulong)((long)local_168.
                                            super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_168.
                                           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
    }
    bVar5 = true;
    do {
      bVar2 = bVar5;
      pcVar20 = "LowestHalf";
      if (bVar2) {
        pcVar20 = "";
      }
      local_380._0_8_ = &local_370;
      pcVar17 = pcVar20 + 10;
      if (bVar2) {
        pcVar17 = pcVar20;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,pcVar20,pcVar17);
      if (bVar2) {
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)local_3a8,&local_138);
      }
      else {
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)local_3a8,&local_138,0.5);
      }
      local_2e8 = (undefined1  [8])local_3f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"\nStatistics computed from ",0x1a);
      pcVar20 = "only the lowest 50%";
      if (bVar2) {
        pcVar20 = "all";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,pcVar20,(ulong)(byte)~bVar2 << 4 | 3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0," of the above measurements:",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
      std::ios_base::~ios_base(local_270);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eae1);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      fVar26 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)local_3a8);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb15);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      uVar19 = (long)(local_3a8._8_8_ - local_3a8._0_8_) >> 3;
      uVar18 = (uint)uVar19;
      if ((int)uVar18 < 1) {
        fVar26 = 0.0;
      }
      else {
        fVar26 = 0.0;
        uVar21 = 0;
        do {
          fVar26 = fVar26 + (float)*(long *)(local_3a8._0_8_ + uVar21 * 8);
          uVar21 = uVar21 + 1;
        } while ((uVar18 & 0x7fffffff) != uVar21);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,(fVar26 / (float)uVar19) / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb1d);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      pPVar16 = (Performance *)(local_3a8._0_8_ + 8);
      pPVar14 = (Performance *)local_3a8._0_8_;
      if (pPVar16 != (Performance *)local_3a8._8_8_ && local_3a8._0_8_ != local_3a8._8_8_) {
        lVar25 = *(long *)local_3a8._0_8_;
        do {
          if (*(long *)pPVar16 < lVar25) {
            pPVar14 = pPVar16;
            lVar25 = *(long *)pPVar16;
          }
          pPVar16 = pPVar16 + 8;
        } while (pPVar16 != (Performance *)local_3a8._8_8_);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,(float)*(long *)pPVar14 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb25);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      pPVar16 = (Performance *)(local_3a8._0_8_ + 8);
      pPVar14 = (Performance *)local_3a8._0_8_;
      if (pPVar16 != (Performance *)local_3a8._8_8_ && local_3a8._0_8_ != local_3a8._8_8_) {
        lVar25 = *(long *)local_3a8._0_8_;
        do {
          lVar1 = *(long *)pPVar16;
          lVar22 = lVar25;
          if (lVar25 <= lVar1) {
            lVar22 = lVar1;
          }
          if (lVar25 < lVar1) {
            pPVar14 = pPVar16;
          }
          pPVar16 = pPVar16 + 8;
          lVar25 = lVar22;
        } while (pPVar16 != (Performance *)local_3a8._8_8_);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,(float)*(long *)pPVar14 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb2d);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      fVar26 = vectorFloatMedianAbsoluteDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)local_3a8);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb67);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"");
      fVar26 = vectorFloatMedianAbsoluteDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)local_3a8);
      local_318 = CONCAT44(extraout_XMM0_Db,fVar26);
      fVar26 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)local_3a8);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_NONE,
                 (float)(~-(uint)(fVar26 == 0.0) & (uint)((float)local_318 / fVar26)));
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65eb8a);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      fVar26 = vectorFloatStandardDeviation<long>
                         ((Performance *)local_3a8._0_8_,
                          (vector<long,_std::allocator<long>_> *)local_3a8._8_8_);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65ebb7);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"");
      fVar26 = vectorFloatRelativeStandardDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)local_3a8);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_NONE,fVar26);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar15) {
        local_3e8._16_8_ = *psVar15;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = *psVar15;
        local_3e8._0_8_ = (size_type *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65ebd3);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ms","");
      fVar26 = vectorFloatMaximumMinusMinimum<long>
                         ((Performance *)local_3a8._0_8_,
                          (vector<long,_std::allocator<long>_> *)local_3a8._8_8_);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_450);
      local_3e8._0_8_ = local_3e8 + 0x10;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar23) {
        local_3e8._16_8_ = paVar23->_M_allocated_capacity;
        local_3e8._24_8_ = plVar13[3];
      }
      else {
        local_3e8._16_8_ = paVar23->_M_allocated_capacity;
        local_3e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar13;
      }
      local_3e8._8_8_ = plVar13[1];
      *plVar13 = (long)paVar23;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410," of total time","");
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x65ebef);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar15 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470.field_2._8_4_ = (undefined4)plVar13[3];
        local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar15;
        local_470._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_470._M_string_length = plVar13[1];
      *plVar13 = (long)psVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"");
      fVar26 = vectorFloatRelativeMaximumMinusMinimum<long>
                         ((Performance *)local_3a8._0_8_,
                          (vector<long,_std::allocator<long>_> *)local_3a8._8_8_);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_2e8,(string *)local_3e8,&local_470,&local_430,
                 QP_KEY_TAG_NONE,fVar26);
      tcu::TestLog::writeFloat
                (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                 local_288,local_284);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        __return_storage_ptr__ = (Logs *)local_3a8;
        fVar26 = vectorFloatMedianAbsoluteDeviation<long>
                           ((vector<long,_std::allocator<long>_> *)__return_storage_ptr__);
        local_318 = CONCAT44(local_318._4_4_,fVar26);
        fVar26 = vectorFloatMedian<long>
                           ((vector<long,_std::allocator<long>_> *)__return_storage_ptr__);
        if (((fVar26 != 0.0) || (NAN(fVar26))) && (0.05 < (float)local_318 / fVar26)) {
          local_2e8 = (undefined1  [8])local_3f0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2e0,
                     "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                     ,0x54);
          std::ostream::_M_insert<double>(0.05000000074505806);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
          std::ios_base::~ios_base(local_270);
        }
      }
      if ((Performance *)local_3a8._0_8_ != (Performance *)0x0) {
        operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity - local_3a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ != &local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) +
                        1);
      }
      bVar5 = false;
    } while (bVar2);
    tcu::TestLog::endSection(local_3f0);
    uVar19 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
    do {
      pcVar20 = "Average";
      if ((char)uVar19 != '\0') {
        pcVar20 = "Median";
      }
      local_380._0_8_ = &local_370;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_380,pcVar20,pcVar20 + (uVar19 & 0xff ^ 7));
      local_3e8._0_8_ = local_3e8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3e8,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
      std::__cxx11::string::append((char *)local_3e8);
      local_d8 = vectorFloatAverage<long>;
      if ((char)uVar19 != '\0') {
        local_d8 = vectorFloatMedian<long>;
      }
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,local_3e8._0_8_,(char *)(local_3e8._0_8_ + local_3e8._8_8_));
      std::__cxx11::string::append((char *)&local_450);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,local_3e8._0_8_,(char *)(local_3e8._0_8_ + local_3e8._8_8_));
      std::__cxx11::string::append((char *)&local_470);
      tcu::LogSection::LogSection((LogSection *)local_2e8,&local_450,&local_470);
      tcu::TestLog::startSection(local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_);
      if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
        operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      local_cc = (uint)uVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      bVar5 = true;
      do {
        bVar2 = bVar5;
        pcVar20 = "LowestHalf";
        if (bVar2) {
          pcVar20 = "";
        }
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        pcVar17 = pcVar20 + 10;
        if (bVar2) {
          pcVar17 = pcVar20;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,pcVar20,pcVar17);
        local_318 = CONCAT44(local_318._4_4_,0x3f800000);
        if (!bVar2) {
          local_318 = CONCAT44(local_318._4_4_,0x3f000000);
        }
        local_2e8 = (undefined1  [8])local_3f0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        pcVar20 = "\nFor only the lowest 50% of the measurements:";
        if (bVar2) {
          pcVar20 = "For all measurements:";
        }
        lVar25 = 0x2d;
        if (bVar2) {
          lVar25 = 0x15;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e0,pcVar20,lVar25);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
        std::ios_base::~ios_base(local_270);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_410,local_450._M_dataplus._M_p,
                   local_450._M_dataplus._M_p + local_450._M_string_length);
        std::__cxx11::string::append((char *)&local_410);
        plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_410,local_380._0_8_);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470.field_2._8_4_ = (undefined4)plVar13[3];
          local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
        }
        else {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_470._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_3a8._0_8_ = local_3a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a8,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
        std::__cxx11::string::append((char *)local_3a8);
        plVar13 = (long *)std::__cxx11::string::append((char *)local_3a8);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430.field_2._8_8_ = plVar13[3];
        }
        else {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_430._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ms","");
        vectorLowestPercentage<long>(&local_150,&local_88,(float)local_318);
        fVar26 = (float)(*local_d8)(&local_150);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_2e8,&local_470,&local_430,&local_308,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                   local_288,local_284);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._16_8_ != &local_298) {
          operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
          operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
        }
        if (local_2e8 != (undefined1  [8])local_2d8) {
          operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
        }
        if (local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
          operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_410,local_450._M_dataplus._M_p,
                   local_450._M_dataplus._M_p + local_450._M_string_length);
        std::__cxx11::string::append((char *)&local_410);
        plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_410,local_380._0_8_);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470.field_2._8_4_ = (undefined4)plVar13[3];
          local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
        }
        else {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_470._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_3a8._0_8_ = local_3a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a8,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
        std::__cxx11::string::append((char *)local_3a8);
        plVar13 = (long *)std::__cxx11::string::append((char *)local_3a8);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430.field_2._8_8_ = plVar13[3];
        }
        else {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_430._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ms","");
        vectorLowestPercentage<long>(&local_150,&local_a8,(float)local_318);
        fVar26 = (float)(*local_d8)(&local_150);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_2e8,&local_470,&local_430,&local_308,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                   local_288,local_284);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._16_8_ != &local_298) {
          operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
          operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
        }
        if (local_2e8 != (undefined1  [8])local_2d8) {
          operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
        }
        if (local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
          operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_410,local_450._M_dataplus._M_p,
                   local_450._M_dataplus._M_p + local_450._M_string_length);
        std::__cxx11::string::append((char *)&local_410);
        plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_410,local_380._0_8_);
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470.field_2._8_4_ = (undefined4)plVar13[3];
          local_470.field_2._12_4_ = *(undefined4 *)((long)(plVar13 + 3) + 4);
        }
        else {
          local_470.field_2._M_allocated_capacity = *psVar15;
          local_470._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_470._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_3a8._0_8_ = local_3a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a8,local_380._0_8_,(char *)(local_380._0_8_ + local_380._8_8_));
        std::__cxx11::string::append((char *)local_3a8);
        plVar13 = (long *)std::__cxx11::string::append((char *)local_3a8);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430.field_2._8_8_ = plVar13[3];
        }
        else {
          local_430.field_2._M_allocated_capacity = *psVar15;
          local_430._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_430._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ms","");
        vectorLowestPercentage<long>(&local_150,&local_c8,(float)local_318);
        fVar26 = (float)(*local_d8)(&local_150);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_2e8,&local_470,&local_430,&local_308,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_3f0,(char *)local_2e8,(char *)local_2d8._16_8_,(char *)local_2b8._16_8_,
                   local_288,local_284);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._16_8_ != &local_298) {
          operator_delete((void *)local_2b8._16_8_,local_298._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d8._16_8_ != local_2b8) {
          operator_delete((void *)local_2d8._16_8_,local_2b8._0_8_ + 1);
        }
        if (local_2e8 != (undefined1  [8])local_2d8) {
          operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
        }
        if (local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_150.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        if ((Performance *)local_3a8._0_8_ != (Performance *)(local_3a8 + 0x10)) {
          operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      } while (bVar2);
      tcu::TestLog::endSection(local_3f0);
      uVar18 = local_cc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ != &local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) +
                        1);
      }
      uVar19 = 0;
    } while ((uVar18 & 1) != 0);
    local_2e8 = (undefined1  [8])local_3f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2e0,
               "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times"
               ,0x67);
    _Var24._M_p = local_388._M_p;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
    std::ios_base::~ios_base(local_270);
    fVar26 = vectorFloatFirstQuartile<long>(&local_138);
    this_00 = *(TestContext **)(_Var24._M_p + 8);
    de::floatToString_abi_cxx11_((string *)local_2e8,(de *)0x2,fVar26 / 1000.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_2e8);
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
    }
    local_2e8 = (undefined1  [8])local_3f0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2e0,
               "Note: the following shaders are the ones from the last iteration; variables\' names and some constant expressions differ between iterations."
               ,0x8b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
    std::ios_base::~ios_base(local_270);
    logProgramData((InvalidShaderCompilerCase *)_Var24._M_p,(BuildInfo *)local_120,
                   (ProgramContext *)local_70);
    if (local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar19 = (long)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
LAB_004450d7:
      operator_delete(paVar23,uVar19);
    }
LAB_004450dc:
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    if (local_118 != (Shaders)((long)local_110 + 8)) {
      operator_delete((void *)local_118,CONCAT71(local_110._9_7_,local_110[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if (local_70._0_8_ != (long)local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.
           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
           ._M_impl.super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return STOP;
    }
    uVar19 = (long)local_168.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_168.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.
                 super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  }
  operator_delete(paVar23,uVar19);
  return STOP;
}

Assistant:

InvalidShaderCompilerCase::IterateResult InvalidShaderCompilerCase::iterate (void)
{
	ShaderValidity shaderValidity = m_invalidityType == INVALIDITY_INVALID_CHAR		? SHADER_VALIDITY_INVALID_CHAR
								  : m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
								  : SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	// Before actual measurements, compile a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);

		Shaders shaders = createShaders();
		setShaderSources(shaders, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			buildInfo.logs = getLogs(shaders);
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}
		cleanup(shaders);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shader and compile. Measure time.

		// \note Shader sources are generated and GL shader objects are created before any time measurements.
		ProgramContext	progCtx		= generateShaderSources((int)measurements.size());
		Shaders			shaders		= createShaders();
		BuildInfo		buildInfo;

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shaders, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.logs = getLogs(shaders);

		// Both shader compilations should have failed.
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}

		// De-initializations (delete shaders).

		cleanup(shaders);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> totalTimes;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation times");

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			sourceSetTimes.push_back		(measurements[ndx].sourceSetTime);
			vertexCompileTimes.push_back	(measurements[ndx].vertexCompileTime);
			fragmentCompileTimes.push_back	(measurements[ndx].fragmentCompileTime);
			totalTimes.push_back			(measurements[ndx].totalTime());

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "Time",
								  "Measurement " + de::toString(ndx) + " time",
								  "ms", QP_KEY_TAG_TIME, (float)measurements[ndx].totalTime()/1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange	= entireRangeOrLowestHalf == 0;
			string				statNamePrefix	= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTimes		= isEntireRange ? totalTimes : vectorLowestPercentage(totalTimes, 0.5f);

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

#define LOG_TIME_STAT(NAME, DESC, FUNC)			log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "ms",	QP_KEY_TAG_TIME, (FUNC)(rangeTimes)/1000.0f)
#define LOG_RELATIVE_STAT(NAME, DESC, FUNC)		log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "",		QP_KEY_TAG_NONE, (FUNC)(rangeTimes))

			LOG_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_TIME_STAT
#undef LOG_RELATIVE_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value " << RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimes) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		log << TestLog::Message << "Note: the following shaders are the ones from the last iteration; variables' names and some constant expressions differ between iterations." << TestLog::EndMessage;

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}